

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayImpDirWrapper.cpp
# Opt level: O3

QString * __thiscall
DelayImpEntryWrapper::getName(QString *__return_storage_ptr__,DelayImpEntryWrapper *this)

{
  int iVar1;
  undefined4 extraout_var;
  storage_type *psVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  qsizetype local_28;
  
  iVar1 = (*(this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x31])(this);
  if ((char *)CONCAT44(extraout_var,iVar1) == (char *)0x0) {
    QVar4.m_data = (storage_type *)0x0;
    QVar4.m_size = (qsizetype)&local_38;
    QString::fromUtf8(QVar4);
  }
  else {
    psVar2 = (storage_type *)strlen((char *)CONCAT44(extraout_var,iVar1));
    QVar3.m_data = psVar2;
    QVar3.m_size = (qsizetype)&local_38;
    QString::fromUtf8(QVar3);
  }
  *(undefined4 *)&(__return_storage_ptr__->d).d = local_38;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uStack_34;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = uStack_30;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uStack_2c;
  (__return_storage_ptr__->d).size = local_28;
  return __return_storage_ptr__;
}

Assistant:

QString DelayImpEntryWrapper::getName()
{
    char* name = getLibraryName();
    if (!name) return "";
    return QString(name);
}